

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code-generator.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint nonce;
  int iVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  AssemblyGeneratorX86 asmX86;
  Blake2Generator gen;
  SuperscalarProgram p;
  undefined1 local_1288 [128];
  ios_base local_1208 [296];
  Blake2Generator local_10e0;
  SuperscalarProgram local_1098;
  
  if (0 < argc) {
    lVar1 = (ulong)(uint)argc - 1;
    lVar6 = 0;
    do {
      iVar2 = strcmp(argv[lVar6],"--softAes");
      if (iVar2 == 0) break;
      bVar8 = lVar1 != lVar6;
      lVar6 = lVar6 + 1;
    } while (bVar8);
    lVar6 = 0;
    do {
      iVar3 = strcmp(argv[lVar6],"--genAsm");
      if (iVar3 == 0) break;
      bVar8 = lVar1 != lVar6;
      lVar6 = lVar6 + 1;
    } while (bVar8);
    if (argc != 1) {
      uVar7 = 0;
      do {
        iVar4 = strcmp(argv[uVar7],"--nonce");
        if ((iVar4 == 0) && (nonce = atoi(argv[uVar7 + 1]), 0 < (int)nonce)) goto LAB_0010ae11;
        uVar7 = uVar7 + 1;
      } while (argc - 1 != uVar7);
    }
    nonce = 1000;
LAB_0010ae11:
    lVar6 = 0;
    do {
      iVar4 = strcmp(argv[lVar6],"--genNative");
      if (iVar4 == 0) break;
      bVar8 = lVar1 != lVar6;
      lVar6 = lVar6 + 1;
    } while (bVar8);
    uVar7 = 0;
    do {
      iVar5 = strcmp(argv[uVar7],"--genSuperscalar");
      if (iVar5 == 0) {
        randomx::Blake2Generator::Blake2Generator(&local_10e0,seed,(ulong)nonce,0);
        randomx::generateSuperscalar(&local_1098,&local_10e0);
        std::__cxx11::stringstream::stringstream((stringstream *)local_1288);
        randomx::AssemblyGeneratorX86::generateAsm((AssemblyGeneratorX86 *)local_1288,&local_1098);
        std::ostream::operator<<(&std::cout,(streambuf *)(local_1288 + 0x18));
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1288);
        std::ios_base::~ios_base(local_1208);
        return 0;
      }
      uVar7 = uVar7 + 1;
    } while ((uint)argc != uVar7);
    if (iVar3 == 0) {
      if (iVar2 != 0) {
        generateAsm<false>(nonce);
        return 0;
      }
      generateAsm<true>(nonce);
      return 0;
    }
    if (iVar4 == 0) {
      if (iVar2 != 0) {
        generateNative<false>(nonce);
        return 0;
      }
      generateNative<true>(nonce);
      return 0;
    }
  }
  printUsage(*argv);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	bool softAes, genAsm, genNative, genSuperscalar;
	int nonce;

	readOption("--softAes", argc, argv, softAes);
	readOption("--genAsm", argc, argv, genAsm);
	readIntOption("--nonce", argc, argv, nonce, 1000);
	readOption("--genNative", argc, argv, genNative);
	readOption("--genSuperscalar", argc, argv, genSuperscalar);

	if (genSuperscalar) {
		randomx::SuperscalarProgram p;
		randomx::Blake2Generator gen(seed, nonce);
		randomx::generateSuperscalar(p, gen);
		randomx::AssemblyGeneratorX86 asmX86;
		asmX86.generateAsm(p);
		asmX86.printCode(std::cout);
		return 0;
	}

	if (genAsm) {
		if (softAes)
			generateAsm<true>(nonce);
		else
			generateAsm<false>(nonce);
		return 0;
	}

	if (genNative) {
		if (softAes)
			generateNative<true>(nonce);
		else
			generateNative<false>(nonce);
		return 0;
	}

	printUsage(argv[0]);
	return 0;
}